

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

void __thiscall Lowerer::GenerateFastBrBReturn(Lowerer *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  BYTE scale;
  DWORD offset;
  undefined4 *puVar4;
  LabelInstr *target;
  LabelInstr *target_00;
  Opnd *pOVar5;
  IntConstOpnd *pIVar6;
  Lowerer *pLVar7;
  RegOpnd *pRVar8;
  IndirOpnd *pIVar9;
  Lowerer *baseOpnd;
  LabelInstr *target_01;
  RegOpnd *pRVar10;
  RegOpnd *dst;
  Opnd *pOVar11;
  char *this_00;
  LabelInstr *target_02;
  
  if ((instr->m_opcode != BrOnEmpty) && (instr->m_opcode != BrOnNotEmpty)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x270c,
                       "(instr->m_opcode == Js::OpCode::BrOnEmpty || instr->m_opcode == Js::OpCode::BrOnNotEmpty)"
                       ,
                       "instr->m_opcode == Js::OpCode::BrOnEmpty || instr->m_opcode == Js::OpCode::BrOnNotEmpty"
                      );
    if (!bVar2) goto LAB_005b6245;
    *puVar4 = 0;
  }
  pOVar11 = instr->m_src1;
  if ((pOVar11 == (Opnd *)0x0) || (instr->m_src2 != (Opnd *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x270d,"(instr->GetSrc1() != nullptr && instr->GetSrc2() == nullptr)",
                       "Expected 1 src opnds on BrB");
    if (!bVar2) goto LAB_005b6245;
    *puVar4 = 0;
    pOVar11 = instr->m_src1;
  }
  target = IR::LabelInstr::New(Label,this->m_func,true);
  target_00 = IR::LabelInstr::New(Label,this->m_func,false);
  pOVar5 = GetForInEnumeratorFieldOpnd(this,pOVar11,0x50,TyInt8);
  pLVar7 = (Lowerer *)0x0;
  pIVar6 = IR::IntConstOpnd::New(0,TyInt8,this->m_func,false);
  InsertCompareBranch(pLVar7,pOVar5,&pIVar6->super_Opnd,BrEq_A,false,target,instr,false);
  pLVar7 = (Lowerer *)IR::RegOpnd::New(TyUint64,this->m_func);
  pOVar5 = GetForInEnumeratorFieldOpnd(this,pOVar11,8,TyUint64);
  InsertMove((Opnd *)pLVar7,pOVar5,instr,true);
  pRVar8 = IR::RegOpnd::New(TyUint64,this->m_func);
  pOVar5 = GetForInEnumeratorFieldOpnd(this,pOVar11,0x10,TyUint64);
  InsertMove(&pRVar8->super_Opnd,pOVar5,instr,true);
  offset = Js::DynamicObject::GetOffsetOfType();
  pIVar9 = IR::IndirOpnd::New((RegOpnd *)pLVar7,offset,TyUint64,this->m_func,false);
  InsertCompareBranch(pLVar7,&pRVar8->super_Opnd,&pIVar9->super_Opnd,BrNeq_A,false,target,instr,
                      false);
  baseOpnd = (Lowerer *)IR::RegOpnd::New(TyUint64,this->m_func);
  pOVar5 = GetForInEnumeratorFieldOpnd(this,pOVar11,0x28,TyUint64);
  InsertMove((Opnd *)baseOpnd,pOVar5,instr,true);
  pRVar8 = IR::RegOpnd::New(TyUint32,this->m_func);
  pOVar5 = GetForInEnumeratorFieldOpnd(this,pOVar11,0x20,TyUint32);
  InsertMove(&pRVar8->super_Opnd,pOVar5,instr,true);
  pLVar7 = baseOpnd;
  pIVar9 = IR::IndirOpnd::New((RegOpnd *)baseOpnd,0x20,TyUint32,this->m_func,false);
  InsertCompareBranch(pLVar7,&pRVar8->super_Opnd,&pIVar9->super_Opnd,BrLt_A,false,target_00,instr,
                      false);
  target_01 = IR::Instr::GetOrCreateContinueLabel(instr,false);
  pIVar9 = IR::IndirOpnd::New((RegOpnd *)baseOpnd,0x28,TyInt8,this->m_func,false);
  this_00 = (char *)0x0;
  pIVar6 = IR::IntConstOpnd::New(0,TyInt8,this->m_func,false);
  target_02 = target_01;
  if (instr->m_opcode != BrOnNotEmpty) {
    if (instr->m_kind != InstrKindBranch) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      this_00 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
      ;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
      if (!bVar2) goto LAB_005b6245;
      *puVar4 = 0;
    }
    target_02 = (LabelInstr *)instr[1].m_next;
  }
  InsertCompareBranch((Lowerer *)this_00,&pIVar9->super_Opnd,&pIVar6->super_Opnd,BrNeq_A,false,
                      target_02,instr,false);
  InsertBranch(Br,false,target,instr);
  IR::Instr::InsertBefore(instr,&target_00->super_Instr);
  pOVar5 = instr->m_dst;
  OVar3 = IR::Opnd::GetKind(pOVar5);
  if (OVar3 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2741,"(opndDst->IsRegOpnd())","opndDst->IsRegOpnd()");
    if (!bVar2) goto LAB_005b6245;
    *puVar4 = 0;
  }
  pRVar10 = IR::RegOpnd::New(TyUint64,this->m_func);
  pIVar9 = IR::IndirOpnd::New((RegOpnd *)baseOpnd,8,TyUint64,this->m_func,false);
  InsertMove(&pRVar10->super_Opnd,&pIVar9->super_Opnd,instr,true);
  scale = LowererMDArch::GetDefaultIndirScale();
  pIVar9 = IR::IndirOpnd::New(pRVar10,pRVar8,scale,TyVar,this->m_func);
  InsertMove(pOVar5,&pIVar9->super_Opnd,instr,true);
  pRVar10 = IR::RegOpnd::New(TyUint64,this->m_func);
  pIVar9 = IR::IndirOpnd::New((RegOpnd *)baseOpnd,0x10,TyUint64,this->m_func,false);
  InsertMove(&pRVar10->super_Opnd,&pIVar9->super_Opnd,instr,true);
  dst = IR::RegOpnd::New(TyUint32,this->m_func);
  pIVar9 = IR::IndirOpnd::New(pRVar10,pRVar8,'\x02',TyUint32,this->m_func);
  InsertMove(&dst->super_Opnd,&pIVar9->super_Opnd,instr,true);
  pOVar5 = GetForInEnumeratorFieldOpnd(this,pOVar11,0x18,TyUint32);
  InsertMove(pOVar5,&dst->super_Opnd,instr,true);
  pIVar6 = IR::IntConstOpnd::New(1,TyUint32,this->m_func,false);
  InsertAdd(false,&pRVar8->super_Opnd,&pRVar8->super_Opnd,&pIVar6->super_Opnd,instr);
  pOVar11 = GetForInEnumeratorFieldOpnd(this,pOVar11,0x20,TyUint32);
  InsertMove(pOVar11,&pRVar8->super_Opnd,instr,true);
  if (instr->m_opcode == BrOnNotEmpty) {
    if (instr->m_kind != InstrKindBranch) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
      if (!bVar2) {
LAB_005b6245:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    target_01 = (LabelInstr *)instr[1].m_next;
  }
  InsertBranch(Br,false,target_01,instr);
  IR::Instr::InsertBefore(instr,&target->super_Instr);
  return;
}

Assistant:

void
Lowerer::GenerateFastBrBReturn(IR::Instr * instr)
{
    Assert(instr->m_opcode == Js::OpCode::BrOnEmpty || instr->m_opcode == Js::OpCode::BrOnNotEmpty);
    AssertMsg(instr->GetSrc1() != nullptr && instr->GetSrc2() == nullptr, "Expected 1 src opnds on BrB");

    IR::Opnd * forInEnumeratorOpnd = instr->GetSrc1();
    IR::LabelInstr * labelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);
    IR::LabelInstr * loopBody = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);

    // CMP forInEnumerator->canUseJitFastPath, 0
    // JEQ $helper
    IR::Opnd * canUseJitFastPathOpnd = GetForInEnumeratorFieldOpnd(forInEnumeratorOpnd, Js::ForInObjectEnumerator::GetOffsetOfCanUseJitFastPath(), TyInt8);
    InsertCompareBranch(canUseJitFastPathOpnd, IR::IntConstOpnd::New(0, TyInt8, this->m_func), Js::OpCode::BrEq_A, labelHelper, instr);

    // MOV objectOpnd, forInEnumerator->enumerator.object
    // MOV cachedDataTypeOpnd, forInEnumerator->enumerator.cachedDataType
    // CMP cachedDataTypeOpnd, objectOpnd->type
    // JNE $helper
    IR::RegOpnd * objectOpnd = IR::RegOpnd::New(TyMachPtr, this->m_func);
    InsertMove(objectOpnd,
        GetForInEnumeratorFieldOpnd(forInEnumeratorOpnd, Js::ForInObjectEnumerator::GetOffsetOfEnumeratorObject(), TyMachPtr), instr);
    IR::RegOpnd * cachedDataTypeOpnd = IR::RegOpnd::New(TyMachPtr, this->m_func);
    InsertMove(cachedDataTypeOpnd,
        GetForInEnumeratorFieldOpnd(forInEnumeratorOpnd, Js::ForInObjectEnumerator::GetOffsetOfEnumeratorInitialType(), TyMachPtr), instr);
    InsertCompareBranch(cachedDataTypeOpnd, IR::IndirOpnd::New(objectOpnd, Js::DynamicObject::GetOffsetOfType(), TyMachPtr, this->m_func),
        Js::OpCode::BrNeq_A, labelHelper, instr);

    // MOV cachedDataOpnd, forInEnumeratorOpnd->enumerator.cachedData
    // MOV enumeratedCountOpnd, forInEnumeratorOpnd->enumerator.enumeratedCount
    // CMP enumeratedCountOpnd, cachedDataOpnd->cachedCount
    // JLT $loopBody
    IR::RegOpnd * cachedDataOpnd = IR::RegOpnd::New(TyMachPtr, m_func);
    InsertMove(cachedDataOpnd,
        GetForInEnumeratorFieldOpnd(forInEnumeratorOpnd, Js::ForInObjectEnumerator::GetOffsetOfEnumeratorCachedData(), TyMachPtr), instr);
    IR::RegOpnd * enumeratedCountOpnd = IR::RegOpnd::New(TyUint32, m_func);
    InsertMove(enumeratedCountOpnd,
        GetForInEnumeratorFieldOpnd(forInEnumeratorOpnd, Js::ForInObjectEnumerator::GetOffsetOfEnumeratorEnumeratedCount(), TyUint32), instr);
    InsertCompareBranch(enumeratedCountOpnd,
        IR::IndirOpnd::New(cachedDataOpnd, Js::DynamicObjectPropertyEnumerator::GetOffsetOfCachedDataCachedCount(), TyUint32, this->m_func),
        Js::OpCode::BrLt_A, loopBody, instr);

    // CMP cacheData.completed, 0
    // JNE $loopEnd
    // JMP $helper
    IR::LabelInstr * labelAfter = instr->GetOrCreateContinueLabel();
    InsertCompareBranch(
        IR::IndirOpnd::New(cachedDataOpnd, Js::DynamicObjectPropertyEnumerator::GetOffsetOfCachedDataCompleted(), TyInt8, this->m_func),
        IR::IntConstOpnd::New(0, TyInt8, this->m_func),
        Js::OpCode::BrNeq_A, instr->m_opcode == Js::OpCode::BrOnNotEmpty ? labelAfter : instr->AsBranchInstr()->GetTarget(), instr);
    InsertBranch(Js::OpCode::Br, labelHelper, instr);

    // $loopBody:
    instr->InsertBefore(loopBody);

    IR::Opnd * opndDst = instr->GetDst(); // ForIn result propertyString
    Assert(opndDst->IsRegOpnd());

    // MOV stringsOpnd, cachedData->strings
    // MOV opndDst, stringsOpnd[enumeratedCount]
    IR::RegOpnd * stringsOpnd = IR::RegOpnd::New(TyMachPtr, m_func);
    InsertMove(stringsOpnd,
        IR::IndirOpnd::New(cachedDataOpnd, Js::DynamicObjectPropertyEnumerator::GetOffsetOfCachedDataStrings(), TyMachPtr, this->m_func), instr);
    InsertMove(opndDst,
        IR::IndirOpnd::New(stringsOpnd, enumeratedCountOpnd, m_lowererMD.GetDefaultIndirScale(), TyVar, this->m_func), instr);

    // MOV indexesOpnd, cachedData->indexes
    // MOV objectIndexOpnd, indexesOpnd[enumeratedCount]
    // MOV forInEnumeratorOpnd->enumerator.objectIndex, objectIndexOpnd
    IR::RegOpnd * indexesOpnd = IR::RegOpnd::New(TyMachPtr, m_func);
    InsertMove(indexesOpnd,
        IR::IndirOpnd::New(cachedDataOpnd, Js::DynamicObjectPropertyEnumerator::GetOffsetOfCachedDataIndexes(), TyMachPtr, this->m_func), instr);
    IR::RegOpnd * objectIndexOpnd = IR::RegOpnd::New(TyUint32, m_func);
    InsertMove(objectIndexOpnd,
        IR::IndirOpnd::New(indexesOpnd, enumeratedCountOpnd, IndirScale4, TyUint32, this->m_func), instr);
    InsertMove(GetForInEnumeratorFieldOpnd(forInEnumeratorOpnd, Js::ForInObjectEnumerator::GetOffsetOfEnumeratorObjectIndex(), TyUint32),
        objectIndexOpnd, instr);
    // INC enumeratedCountOpnd
    // MOV forInEnumeratorOpnd->enumerator.enumeratedCount, enumeratedCountOpnd
    InsertAdd(false, enumeratedCountOpnd, enumeratedCountOpnd, IR::IntConstOpnd::New(1, TyUint32, this->m_func), instr);
    InsertMove(GetForInEnumeratorFieldOpnd(forInEnumeratorOpnd, Js::ForInObjectEnumerator::GetOffsetOfEnumeratorEnumeratedCount(), TyUint32),
        enumeratedCountOpnd, instr);

    // We know result propertyString (opndDst) != NULL
    InsertBranch(Js::OpCode::Br, instr->m_opcode == Js::OpCode::BrOnNotEmpty ? instr->AsBranchInstr()->GetTarget() : labelAfter, instr);

    // $helper
    instr->InsertBefore(labelHelper);
    // $after
}